

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void dlib::
     isort_array<std::__cxx11::string[29],dlib::open_file_box_helper::case_insensitive_compare>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_0_ *array,
               unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  unsigned_long j;
  unsigned_long i;
  unsigned_long pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  
  a = in_RSI + 1;
  do {
    b = a;
    if (in_RDX < a) {
      return;
    }
    do {
      b = b + -1;
      bVar1 = open_file_box_helper::case_insensitive_compare::operator()
                        ((case_insensitive_compare *)i,(string *)j,in_RDI);
      if (!bVar1) break;
      exchange<std::__cxx11::string>(a,b);
    } while (b != in_RSI);
    a = a + 1;
  } while( true );
}

Assistant:

void isort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid isort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );
        using namespace sort_helpers;

        unsigned long pos;
        for (unsigned long i = left+1; i <= right; ++i)
        {
            // everything from left to i-1 is sorted.
            pos = i;
            for (unsigned long j = i-1; comp(array[pos] , array[j]); --j)
            {
                exchange(array[pos],array[j]);
                pos = j;
                
                if (j == left)
                    break;
            }
        }
    }